

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

void end_pass(bfgs *b)

{
  ulong uVar1;
  vw *all;
  byte bVar2;
  bool bVar3;
  int iVar4;
  string local_60;
  string local_40;
  
  uVar1 = b->current_pass;
  if (uVar1 <= b->final_pass) {
    if (uVar1 < b->final_pass) {
      all = b->all;
      iVar4 = process_pass(all,b);
      if (b->final_pass == b->current_pass) {
        std::operator<<(&(b->all->trace_message).super_ostream,"Maximum number of passes reached. ")
        ;
        bVar2 = b->output_regularizer;
        if ((bool)bVar2 == false) {
          std::operator<<(&(b->all->trace_message).super_ostream,
                          "If you want to optimize further, increase the number of passes\n");
          bVar2 = b->output_regularizer;
        }
        if ((bVar2 & 1) != 0) {
          std::operator<<(&(b->all->trace_message).super_ostream,
                          "\nRegular model file has been created. ");
          std::operator<<(&(b->all->trace_message).super_ostream,
                          "Output feature regularizer file is created only when the convergence is reached. Try increasing the number of passes for convergence\n"
                         );
          b->output_regularizer = false;
        }
      }
      if ((iVar4 == 0) || (b->final_pass <= b->current_pass)) {
        zero_preconditioner(all);
      }
      else {
        b->final_pass = b->current_pass;
      }
      if (all->holdout_set_off == false) {
        bVar3 = summarize_holdout_set(all,&b->no_win_counter);
        if (bVar3) {
          std::__cxx11::string::string((string *)&local_40,(string *)&all->final_regressor_name);
          finalize_regressor(all,&local_40);
          std::__cxx11::string::~string((string *)&local_40);
        }
        if (b->early_stop_thres == b->no_win_counter) {
          set_done(all);
          std::operator<<(&(b->all->trace_message).super_ostream,
                          "Early termination reached w.r.t. holdout set error");
        }
      }
      if (b->final_pass == b->current_pass) {
        std::__cxx11::string::string((string *)&local_60,(string *)&all->final_regressor_name);
        finalize_regressor(all,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        set_done(all);
      }
    }
    else {
      b->current_pass = uVar1 + 1;
    }
  }
  return;
}

Assistant:

void end_pass(bfgs& b)
{
  vw* all = b.all;

  if (b.current_pass <= b.final_pass)
  {
    if (b.current_pass < b.final_pass)
    {
      int status = process_pass(*all, b);

      // reaching the max number of passes regardless of convergence
      if (b.final_pass == b.current_pass)
      {
        b.all->trace_message << "Maximum number of passes reached. ";
        if (!b.output_regularizer)
          b.all->trace_message << "If you want to optimize further, increase the number of passes\n";
        if (b.output_regularizer)
        {
          b.all->trace_message << "\nRegular model file has been created. ";
          b.all->trace_message << "Output feature regularizer file is created only when the convergence is reached. "
                                  "Try increasing the number of passes for convergence\n";
          b.output_regularizer = false;
        }
      }

      // attain convergence before reaching max iterations
      if (status != LEARN_OK && b.final_pass > b.current_pass)
      {
        b.final_pass = b.current_pass;
      }
      else
      {
        // Not converged yet.
        // Reset preconditioner to zero so that it is correctly recomputed in the next pass
        zero_preconditioner(*all);
      }
      if (!all->holdout_set_off)
      {
        if (summarize_holdout_set(*all, b.no_win_counter))
          finalize_regressor(*all, all->final_regressor_name);
        if (b.early_stop_thres == b.no_win_counter)
        {
          set_done(*all);
          b.all->trace_message << "Early termination reached w.r.t. holdout set error";
        }
      }
      if (b.final_pass == b.current_pass)
      {
        finalize_regressor(*all, all->final_regressor_name);
        set_done(*all);
      }
    }
    else  // reaching convergence in the previous pass
      b.current_pass++;
  }
}